

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_pool16c_nanomips_insn(DisasContext_conflict6 *ctx)

{
  int rd;
  int rt_00;
  uint32_t uVar1;
  int rs;
  int rt;
  DisasContext_conflict6 *ctx_local;
  
  rd = decode_gpr_gpr3(ctx->opcode >> 7 & 7);
  rt_00 = decode_gpr_gpr3(ctx->opcode >> 4 & 7);
  uVar1 = extract32(ctx->opcode,2,2);
  switch(uVar1) {
  case 0:
    gen_logic(ctx,0x27,rd,rt_00,0);
    break;
  case 1:
    gen_logic(ctx,0x26,rd,rd,rt_00);
    break;
  case 2:
    gen_logic(ctx,0x24,rd,rd,rt_00);
    break;
  case 3:
    gen_logic(ctx,0x25,rd,rd,rt_00);
  }
  return;
}

Assistant:

static void gen_pool16c_nanomips_insn(DisasContext *ctx)
{
    int rt = decode_gpr_gpr3(NANOMIPS_EXTRACT_RT3(ctx->opcode));
    int rs = decode_gpr_gpr3(NANOMIPS_EXTRACT_RS3(ctx->opcode));

    switch (extract32(ctx->opcode, 2, 2)) {
    case NM_NOT16:
        gen_logic(ctx, OPC_NOR, rt, rs, 0);
        break;
    case NM_AND16:
        gen_logic(ctx, OPC_AND, rt, rt, rs);
        break;
    case NM_XOR16:
        gen_logic(ctx, OPC_XOR, rt, rt, rs);
        break;
    case NM_OR16:
        gen_logic(ctx, OPC_OR, rt, rt, rs);
        break;
    }
}